

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O3

uint vrna_sequence_length_max(uint options)

{
  uint uVar1;
  
  uVar1 = 0x7fffffff;
  if ((options & 0x10) == 0) {
    uVar1 = 0x7fff;
  }
  return uVar1;
}

Assistant:

PUBLIC unsigned int
vrna_sequence_length_max(unsigned int options)
{
  if (options & VRNA_OPTION_WINDOW)
    return (unsigned int)INT_MAX;

  /*
   * return (unsigned int)sqrt((double)INT_MAX);
   */
  /*
   *  many functions in RNAlib still rely on the sequence length
   *  at pos 0 in the integer encoded sequence array S. Since this
   *  encoding is stored in a short * array, the maximum length
   *  of any sequence is SHRT_MAX
   */
  return (unsigned int)SHRT_MAX;
}